

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_treeops.c
# Opt level: O1

nbt_node * nbt_filter(nbt_node *tree,nbt_predicate_t filter,void *aux)

{
  nbt_type nVar1;
  char *__s;
  undefined8 uVar2;
  _Bool _Var3;
  int *piVar4;
  nbt_node *__ptr;
  size_t sVar5;
  char *__dest;
  nbt_list *pnVar6;
  uchar *__dest_00;
  size_t __n;
  
  if (filter == (nbt_predicate_t)0x0) {
    __assert_fail("filter",
                  "/workspace/llm4binary/github/license_c_cmakelists/chmod222[P]cNBT/nbt_treeops.c",
                  0x10c,"nbt_node *nbt_filter(const nbt_node *, nbt_predicate_t, void *)");
  }
  piVar4 = __errno_location();
  *piVar4 = 0;
  if ((tree == (nbt_node *)0x0) || (_Var3 = (*filter)(tree,aux), !_Var3)) goto LAB_001048e9;
  __ptr = (nbt_node *)malloc(0x20);
  if (__ptr == (nbt_node *)0x0) goto LAB_001048bf;
  nVar1 = tree->type;
  __ptr->type = nVar1;
  __s = tree->name;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar5 = strlen(__s);
    __dest = (char *)malloc(sVar5 + 1);
    if (__dest == (char *)0x0) {
      __dest = (char *)0x0;
    }
    else {
      strcpy(__dest,__s);
    }
  }
  __ptr->name = __dest;
  if (__s != (char *)0x0 && __dest == (char *)0x0) goto LAB_001048c6;
  switch(nVar1) {
  case TAG_BYTE_ARRAY:
    sVar5 = (size_t)(tree->payload).tag_byte_array.length;
    __n = sVar5;
    break;
  case TAG_STRING:
    pnVar6 = (nbt_list *)_nbt_strdup((tree->payload).tag_string);
    goto LAB_00104906;
  case TAG_LIST:
  case TAG_COMPOUND:
    pnVar6 = filter_list((tree->payload).tag_list,filter,aux);
LAB_00104906:
    (__ptr->payload).tag_list = pnVar6;
    if (pnVar6 != (nbt_list *)0x0) {
      return __ptr;
    }
    goto LAB_001048c6;
  case TAG_INT_ARRAY:
    __n = (size_t)(tree->payload).tag_byte_array.length;
    sVar5 = __n * 4;
    break;
  default:
    uVar2 = *(undefined8 *)((long)&tree->payload + 8);
    (__ptr->payload).tag_long = (tree->payload).tag_long;
    *(undefined8 *)((long)&__ptr->payload + 8) = uVar2;
    return __ptr;
  }
  __dest_00 = (uchar *)malloc(sVar5);
  (__ptr->payload).tag_byte_array.data = __dest_00;
  if (__dest_00 == (uchar *)0x0) {
LAB_001048bf:
    *piVar4 = -2;
LAB_001048c6:
    if (*piVar4 == 0) {
      *piVar4 = -2;
    }
    if (__ptr != (nbt_node *)0x0) {
      free(__ptr->name);
    }
    free(__ptr);
LAB_001048e9:
    __ptr = (nbt_node *)0x0;
  }
  else {
    memcpy(__dest_00,(tree->payload).tag_byte_array.data,__n);
    (__ptr->payload).tag_byte_array.length = (int32_t)__n;
  }
  return __ptr;
}

Assistant:

nbt_node* nbt_filter(const nbt_node* tree, nbt_predicate_t filter, void* aux)
{
    assert(filter);

    errno = NBT_OK;

    if(tree == NULL)       return NULL;
    if(!filter(tree, aux)) return NULL;

    nbt_node* ret = NULL;
    CHECKED_MALLOC(ret, sizeof *ret, goto filter_error);

    ret->type = tree->type;
    ret->name = safe_strdup(tree->name);

    if(tree->name && ret->name == NULL) goto filter_error;

    if(tree->type == TAG_STRING)
    {
        ret->payload.tag_string = _nbt_strdup(tree->payload.tag_string);
        if(ret->payload.tag_string == NULL) goto filter_error;
    }

    else if(tree->type == TAG_BYTE_ARRAY)
    {
        CHECKED_MALLOC(ret->payload.tag_byte_array.data,
                       tree->payload.tag_byte_array.length,
                       goto filter_error);

        memcpy(ret->payload.tag_byte_array.data,
               tree->payload.tag_byte_array.data,
               tree->payload.tag_byte_array.length);

        ret->payload.tag_byte_array.length = tree->payload.tag_byte_array.length;
    }

    else if(tree->type == TAG_INT_ARRAY)
    {
        CHECKED_MALLOC(ret->payload.tag_int_array.data,
                       tree->payload.tag_int_array.length * sizeof(int32_t),
                       goto filter_error);

        memcpy(ret->payload.tag_int_array.data,
               tree->payload.tag_int_array.data,
               tree->payload.tag_int_array.length);

        ret->payload.tag_int_array.length = tree->payload.tag_int_array.length;
    }

    /* Okay, we want to keep this node, but keep traversing the tree! */
    else if(tree->type == TAG_LIST)
    {
        ret->payload.tag_list = filter_list(tree->payload.tag_list, filter, aux);
        if(ret->payload.tag_list == NULL) goto filter_error;
    }
    else if(tree->type == TAG_COMPOUND)
    {
        ret->payload.tag_compound = filter_list(tree->payload.tag_compound, filter, aux);
        if(ret->payload.tag_compound == NULL) goto filter_error;
    }
    else
    {
        ret->payload = tree->payload;
    }

    return ret;

filter_error:
    if(errno == NBT_OK)
        errno = NBT_EMEM;

    if(ret) free(ret->name);

    free(ret);
    return NULL;
}